

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void MOJOSHADER_glDeleteShader(MOJOSHADER_glShader *shader)

{
  void *key_00;
  BoundShaders *shaders;
  void *pvStack_20;
  int morekeys;
  void *iter;
  void *key;
  MOJOSHADER_glShader *shader_local;
  
  key = shader;
  if (ctx->linker_cache != (HashTable *)0x0) {
    iter = (void *)0x0;
    pvStack_20 = (void *)0x0;
    shaders._4_4_ = hash_iter_keys(ctx->linker_cache,&iter,&stack0xffffffffffffffe0);
    while (key_00 = iter, shaders._4_4_ != 0) {
      shaders._4_4_ = hash_iter_keys(ctx->linker_cache,&iter,&stack0xffffffffffffffe0);
      if ((*key_00 == key) || (*(void **)((long)key_00 + 8) == key)) {
        hash_remove(ctx->linker_cache,key_00);
      }
    }
  }
  shader_unref((MOJOSHADER_glShader *)key);
  return;
}

Assistant:

void MOJOSHADER_glDeleteShader(MOJOSHADER_glShader *shader)
{
    // See if this was bound as an unlinked program anywhere...
    if (ctx->linker_cache)
    {
        const void *key = NULL;
        void *iter = NULL;
        int morekeys = hash_iter_keys(ctx->linker_cache, &key, &iter);
        while (morekeys)
        {
            const BoundShaders *shaders = (const BoundShaders *) key;
            // Do this here so we don't confuse the iteration by removing...
            morekeys = hash_iter_keys(ctx->linker_cache, &key, &iter);
            if ((shaders->vertex == shader) || (shaders->fragment == shader))
            {
                // Deletes the linked program, which will unref the shader.
                hash_remove(ctx->linker_cache, shaders);
            } // if
        } // while
    } // if

    shader_unref(shader);
}